

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

void __thiscall AixLog::Log::add_logsink(Log *this,log_sink_ptr *sink)

{
  std::recursive_mutex::lock(&this->mutex_);
  std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
  push_back(&this->log_sinks_,sink);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void add_logsink(const log_sink_ptr& sink) {
    std::lock_guard<std::recursive_mutex> lock(mutex_);
    log_sinks_.push_back(sink);
  }